

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c
# Opt level: O0

void nn_mutex_reset(nn_mutex *self)

{
  FILE *pFVar1;
  uint uVar2;
  char *pcVar3;
  int rc;
  nn_mutex *self_local;
  
  uVar2 = pthread_mutex_unlock((pthread_mutex_t *)self);
  pFVar1 = _stderr;
  if (uVar2 != 0) {
    pcVar3 = nn_err_strerror(uVar2);
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar3,(ulong)uVar2,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/utils/mutex.c"
            ,0x5b);
    fflush(_stderr);
    nn_err_abort();
  }
  pthread_mutex_destroy((pthread_mutex_t *)self);
  uVar2 = pthread_mutex_init((pthread_mutex_t *)self,(pthread_mutexattr_t *)0x0);
  pFVar1 = _stderr;
  if (uVar2 != 0) {
    pcVar3 = nn_err_strerror(uVar2);
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar3,(ulong)uVar2,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/utils/mutex.c"
            ,0x5f);
    fflush(_stderr);
    nn_err_abort();
  }
  uVar2 = pthread_mutex_lock((pthread_mutex_t *)self);
  pFVar1 = _stderr;
  if (uVar2 != 0) {
    pcVar3 = nn_err_strerror(uVar2);
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar3,(ulong)uVar2,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/utils/mutex.c"
            ,0x61);
    fflush(_stderr);
    nn_err_abort();
  }
  return;
}

Assistant:

void nn_mutex_reset (struct nn_mutex *self)
{
    int rc;

    rc = pthread_mutex_unlock (&self->mutex);
    errnum_assert (rc == 0, rc);
    pthread_mutex_destroy (&self->mutex);

    rc = pthread_mutex_init (&self->mutex, NULL);
    errnum_assert (rc == 0, rc);
    rc = pthread_mutex_lock (&self->mutex);
    errnum_assert (rc == 0, rc);
}